

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer_Base.cpp
# Opt level: O0

void __thiscall OSTEI_Writer_Base::DeclarePrimPointers(OSTEI_Writer_Base *this)

{
  bool bVar1;
  ostream *poVar2;
  QAM *in_RDI;
  QAM *it;
  iterator __end1;
  iterator __begin1;
  QAMSet *__range1;
  QAMSet topq;
  OSTEI_HRR_Algorithm_Base *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  QAM *am;
  undefined1 local_c9 [33];
  string local_a8 [32];
  string local_88 [24];
  string *in_stack_ffffffffffffff90;
  QAM *in_stack_ffffffffffffff98;
  _Self local_50;
  _Self local_48;
  undefined1 *local_40;
  undefined1 local_38 [56];
  
  OSTEI_HRR_Writer::Algo(*(OSTEI_HRR_Writer **)&in_RDI->field_0x28);
  OSTEI_HRR_Algorithm_Base::TopAM(in_stack_fffffffffffffea8);
  local_40 = local_38;
  local_48._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffea8);
  local_50._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffffea8);
  while( true ) {
    bVar1 = std::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<QAM>::operator*
              ((_Rb_tree_const_iterator<QAM> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    poVar2 = std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),(string *)indent4_abi_cxx11_)
    ;
    poVar2 = std::operator<<(poVar2,"double * restrict ");
    PrimPtrName_abi_cxx11_(in_RDI);
    poVar2 = std::operator<<(poVar2,local_88);
    poVar2 = std::operator<<(poVar2," = ");
    am = (QAM *)local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_c9 + 1),"",(allocator *)am);
    ArrVarName(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    poVar2 = std::operator<<(poVar2,local_a8);
    poVar2 = std::operator<<(poVar2," + abcd * ");
    QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (QAM *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffeb4 = NCART(am);
    in_stack_fffffffffffffea8 =
         (OSTEI_HRR_Algorithm_Base *)std::ostream::operator<<(poVar2,in_stack_fffffffffffffeb4);
    std::operator<<((ostream *)in_stack_fffffffffffffea8,";\n");
    QAM::~QAM((QAM *)0x155b1c);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)(local_c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c9);
    std::__cxx11::string::~string(local_88);
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  }
  std::operator<<(*(ostream **)((in_RDI->qam)._M_elems + 2),"\n\n");
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x155c4e);
  return;
}

Assistant:

void OSTEI_Writer_Base::DeclarePrimPointers(void) const
{
    auto topq = hrr_writer_.Algo().TopAM();
    for(const auto & it : topq)
    {
        os_ << indent4 << "double * restrict " << PrimPtrName(it)
            << " = " << ArrVarName(it) << " + abcd * " << NCART(it) << ";\n";
    }

    os_ << "\n\n";
}